

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu2_v2.c
# Opt level: O1

MPP_RET hal_jpege_vepu2_set_extra_info(MppDev dev,JpegeSyntax *syntax,RK_U32 start_mbrow)

{
  MPP_RET MVar1;
  VepuOffsetCfg cfg;
  VepuOffsetCfg local_44;
  
  local_44.fmt = syntax->format;
  local_44.width = syntax->width;
  local_44.height = syntax->height;
  local_44.hor_stride = syntax->hor_stride;
  local_44.ver_stride = syntax->ver_stride;
  local_44.offset_x = syntax->offset_x;
  local_44.offset_y = start_mbrow * 0x10 + syntax->offset_y;
  MVar1 = get_vepu_offset_cfg(&local_44);
  if (local_44.offset_byte[0] != 0) {
    MVar1 = mpp_dev_set_reg_offset(dev,0x30,local_44.offset_byte[0]);
  }
  if (local_44.offset_byte[1] != 0) {
    MVar1 = mpp_dev_set_reg_offset(dev,0x31,local_44.offset_byte[1]);
  }
  if (local_44.offset_byte[2] != 0) {
    MVar1 = mpp_dev_set_reg_offset(dev,0x32,local_44.offset_byte[2]);
  }
  return MVar1;
}

Assistant:

static MPP_RET hal_jpege_vepu2_set_extra_info(MppDev dev, JpegeSyntax *syntax,
                                              RK_U32 start_mbrow)
{
    VepuOffsetCfg cfg;

    cfg.fmt = syntax->format;
    cfg.width = syntax->width;
    cfg.height = syntax->height;
    cfg.hor_stride = syntax->hor_stride;
    cfg.ver_stride = syntax->ver_stride;
    cfg.offset_x = syntax->offset_x;
    cfg.offset_y = syntax->offset_y + start_mbrow * 16;

    get_vepu_offset_cfg(&cfg);

    if (cfg.offset_byte[0])
        mpp_dev_set_reg_offset(dev, VEPU2_REG_INPUT_Y, cfg.offset_byte[0]);

    if (cfg.offset_byte[1])
        mpp_dev_set_reg_offset(dev, VEPU2_REG_INPUT_U, cfg.offset_byte[1]);

    if (cfg.offset_byte[2])
        mpp_dev_set_reg_offset(dev, VEPU2_REG_INPUT_V, cfg.offset_byte[2]);

    return MPP_OK;
}